

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

char * arc::readline_fp(char *prompt,FILE *fp)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  char *p;
  size_t len;
  void *pvStack_30;
  int ch;
  char *str;
  size_t size;
  FILE *fp_local;
  char *prompt_local;
  
  str = (char *)0x50;
  p = (char *)0x0;
  printf("%s",prompt);
  pvVar2 = malloc(0x50);
  if (pvVar2 != (void *)0x0) {
    do {
      do {
        pvStack_30 = pvVar2;
        iVar1 = fgetc((FILE *)fp);
        if (iVar1 == -1 || iVar1 == 10) {
          if ((iVar1 == -1) && (p == (char *)0x0)) {
            free(pvStack_30);
            return (char *)0x0;
          }
          *(char *)((long)pvStack_30 + (long)p) = '\0';
          pcVar3 = (char *)realloc(pvStack_30,(size_t)(p + 1));
          return pcVar3;
        }
        pcVar3 = p + 1;
        *(char *)((long)pvStack_30 + (long)p) = (char)iVar1;
        p = pcVar3;
        pvVar2 = pvStack_30;
      } while (pcVar3 != str);
      str = (char *)((long)str << 1);
      pvVar2 = realloc(pvStack_30,(size_t)str);
    } while (pvVar2 != (void *)0x0);
    free(pvStack_30);
  }
  return (char *)0x0;
}

Assistant:

char* readline_fp(const char* prompt, FILE* fp) {
		size_t size = 80;
		/* The size is extended by the input with the value of the provisional */
		char* str;
		int ch;
		size_t len = 0;
		printf("%s", prompt);
		str = (char*)malloc(sizeof(char) * size); /* size is start size */
		if (!str) return NULL;
		while (EOF != (ch = fgetc(fp)) && ch != '\n') {
			str[len++] = ch;
			if (len == size) {
				char* p = (char*)realloc(str, sizeof(char) * (size *= 2));
				if (!p) {
					free(str);
					return NULL;
				}
				str = p;
			}
		}
		if (ch == EOF && len == 0) {
			free(str);
			return NULL;
		}
		str[len++] = '\0';

		return (char*)realloc(str, sizeof(char) * len);
	}